

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_fmad_instruction(Impl *impl,CallInst *instruction)

{
  Builder *this;
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  Operation *this_00;
  Operation *pOVar4;
  Value *pVVar5;
  Type *pTVar6;
  byte local_6d;
  uint local_6c;
  uint i;
  Operation *op;
  Operation *add_op;
  Operation *mul_op;
  Id type_id;
  Id local_24;
  Builder *pBStack_20;
  Id result_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_20 = Converter::Impl::builder(impl);
  this = builder;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
               &type_id,"dx.precise",(ThreadLocalAllocator<char> *)((long)&mul_op + 7));
  bVar2 = LLVMBC::Instruction::hasMetadata((Instruction *)this,(String *)&type_id);
  local_6d = 1;
  if (!bVar2) {
    local_6d = *(byte *)((long)&instruction_local[0x19].super_Instruction.attachments._M_h.
                                _M_buckets + 3);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&type_id);
  pCVar1 = instruction_local;
  if ((local_6d & 1) == 0) {
    if ((int)instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count == 0) {
      IVar3 = spv::Builder::import(pBStack_20,"GLSL.std.450");
      *(Id *)&instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count = IVar3;
    }
    pOVar4 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,(Value *)builder);
    Operation::add_id(pOVar4,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                 _M_element_count);
    Operation::add_literal(pOVar4,0x32);
    for (local_6c = 1; pCVar1 = instruction_local, local_6c < 4; local_6c = local_6c + 1) {
      pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,local_6c);
      IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
      Operation::add_id(pOVar4,IVar3);
    }
    Converter::Impl::add((Impl *)instruction_local,pOVar4,false);
    local_24 = pOVar4->id;
  }
  else {
    pTVar6 = LLVMBC::Value::getType((Value *)builder);
    mul_op._0_4_ = Converter::Impl::get_type_id((Impl *)pCVar1,pTVar6,0);
    pOVar4 = Converter::Impl::allocate((Impl *)instruction_local,OpFMul,(Id)mul_op);
    pCVar1 = instruction_local;
    pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
    Operation::add_id(pOVar4,IVar3);
    pCVar1 = instruction_local;
    pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
    Operation::add_id(pOVar4,IVar3);
    Converter::Impl::add((Impl *)instruction_local,pOVar4,false);
    spv::Builder::addDecoration(pBStack_20,pOVar4->id,DecorationNoContraction,-1);
    pCVar1 = instruction_local;
    pTVar6 = LLVMBC::Value::getType((Value *)builder);
    Converter::Impl::decorate_relaxed_precision((Impl *)pCVar1,pTVar6,pOVar4->id,false);
    this_00 = Converter::Impl::allocate((Impl *)instruction_local,OpFAdd,(Value *)builder);
    Operation::add_id(this_00,pOVar4->id);
    pCVar1 = instruction_local;
    pVVar5 = LLVMBC::Instruction::getOperand((Instruction *)builder,3);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
    Operation::add_id(this_00,IVar3);
    Converter::Impl::add((Impl *)instruction_local,this_00,false);
    spv::Builder::addDecoration(pBStack_20,this_00->id,DecorationNoContraction,-1);
    local_24 = this_00->id;
  }
  pCVar1 = instruction_local;
  pTVar6 = LLVMBC::Value::getType((Value *)builder);
  Converter::Impl::decorate_relaxed_precision((Impl *)pCVar1,pTVar6,local_24,false);
  return true;
}

Assistant:

bool emit_fmad_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id result_id;

	if (instruction->hasMetadata("dx.precise") || impl.options.force_precise)
	{
		// DXIL docs says to split the expression explicitly.
		// HLSL docs says it just has to be invariant.
		// These conflict since we could have used NoContract FMA instead,
		// but at least Big Navi splits fmac into mul + add when doing nocontract fma(), so ...
		spv::Id type_id = impl.get_type_id(instruction->getType());
		Operation *mul_op = impl.allocate(spv::OpFMul, type_id);
		mul_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		mul_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		impl.add(mul_op);
		builder.addDecoration(mul_op->id, spv::DecorationNoContraction);

		impl.decorate_relaxed_precision(instruction->getType(), mul_op->id, false);

		Operation *add_op = impl.allocate(spv::OpFAdd, instruction);
		add_op->add_id(mul_op->id);
		add_op->add_id(impl.get_id_for_value(instruction->getOperand(3)));
		impl.add(add_op);
		builder.addDecoration(add_op->id, spv::DecorationNoContraction);

		result_id = add_op->id;
	}
	else
	{
		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		Operation *op = impl.allocate(spv::OpExtInst, instruction);
		op->add_id(impl.glsl_std450_ext);
		op->add_literal(GLSLstd450Fma);
		for (unsigned i = 1; i < 4; i++)
			op->add_id(impl.get_id_for_value(instruction->getOperand(i)));
		impl.add(op);

		result_id = op->id;
	}

	impl.decorate_relaxed_precision(instruction->getType(), result_id, false);
	return true;
}